

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O3

void __thiscall
t_netstd_generator::generate_netstd_struct_result_writer
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  pointer pcVar4;
  t_field *tfield;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  pointer pptVar8;
  t_netstd_generator *ptVar9;
  string tmpvar;
  string name;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  t_struct *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_118 = tstruct;
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_178._M_dataplus._M_p,local_178._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,
             "public async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken "
             ,0x5f);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                      CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_198._M_dataplus._M_p,local_198._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  paVar2 = &local_178.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_178,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_178._M_dataplus._M_p,local_178._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.IncrementRecursionDepth();",0x20)
  ;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_198._M_dataplus._M_p,local_198._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"try",3);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar6 = (*(local_118->super_t_type).super_t_doc._vptr_t_doc[3])();
  lVar3 = *(long *)CONCAT44(extraout_var,iVar6);
  local_178._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,lVar3,((long *)CONCAT44(extraout_var,iVar6))[1] + lVar3);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"tmp","");
  t_generator::tmp(&local_198,(t_generator *)this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"var ",4);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_198._M_dataplus._M_p,local_198._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," = new TStruct(\"",0x10);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_178._M_dataplus._M_p,local_178._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\");",3);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_158._M_dataplus._M_p,local_158._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"await oprot.WriteStructBeginAsync(",0x22);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_198._M_dataplus._M_p,local_198._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                      CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((local_118->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (local_118->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"tmp","");
    t_generator::tmp(&local_1b8,(t_generator *)this,&local_70);
    std::__cxx11::string::operator=((string *)&local_198,(string *)&local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"var ",4);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_198._M_dataplus._M_p,local_198._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," = new TField();",0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    pptVar8 = (local_118->members_in_id_order_).
              super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar8 !=
        (local_118->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar5 = true;
      do {
        if (bVar5) {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if",2);
        }
        else {
          t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"else if",7);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"(this.__isset.",0xe);
        pcVar4 = ((*pptVar8)->name_)._M_dataplus._M_p;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar4,pcVar4 + ((*pptVar8)->name_)._M_string_length);
        ptVar9 = this;
        normalize_name(&local_158,this,&local_90,false);
        get_isset_name(&local_1b8,ptVar9,&local_158);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + 1;
        bVar5 = type_can_be_null((*pptVar8)->type_);
        if (bVar5) {
          t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (",4);
          prop_name_abi_cxx11_(&local_158,this,*pptVar8,false);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_158._M_dataplus._M_p,local_158._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," != null)",9);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                              ::endl_abi_cxx11_._M_string_length);
          t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p);
          }
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
        }
        t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_198._M_dataplus._M_p,local_198._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".Name = \"",9);
        prop_name_abi_cxx11_(&local_158,this,*pptVar8,false);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_158._M_dataplus._M_p,local_158._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\";",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_198._M_dataplus._M_p,local_198._M_string_length);
        ptVar9 = (t_netstd_generator *)0x39d64a;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".Type = ",8);
        type_to_enum_abi_cxx11_(&local_b0,ptVar9,(*pptVar8)->type_);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_b0._M_dataplus._M_p,local_b0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_d0,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_198._M_dataplus._M_p,local_198._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,".ID = ",6);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(*pptVar8)->key_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"await oprot.WriteFieldBeginAsync(",0x21);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_198._M_dataplus._M_p,local_198._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                            CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        tfield = *pptVar8;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
        generate_serialize_field(this,out,tfield,&local_110,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"await oprot.WriteFieldEndAsync(",0x1f);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                            CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if (bVar5) {
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p);
          }
        }
        piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        pptVar8 = pptVar8 + 1;
        bVar5 = false;
      } while (pptVar8 !=
               (local_118->members_in_id_order_).
               super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"await oprot.WriteFieldStopAsync(",0x20)
  ;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                      CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_158._M_dataplus._M_p,local_158._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"await oprot.WriteStructEndAsync(",0x20)
  ;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                      CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_158,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_158._M_dataplus._M_p,local_158._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"finally",7);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_138,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_138._M_dataplus._M_p,local_138._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"oprot.DecrementRecursionDepth();",0x20)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1b8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_result_writer(ostream& out, t_struct* tstruct)
{
    out << indent() << "public async global::System.Threading.Tasks.Task WriteAsync(TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    out << indent() << "oprot.IncrementRecursionDepth();" << endl
        << indent() << "try" << endl
        << indent() << "{" << endl;
    indent_up();

    string name = tstruct->get_name();
    const vector<t_field*>& fields = tstruct->get_sorted_members();
    vector<t_field*>::const_iterator f_iter;

    string tmpvar = tmp("tmp");
    out << indent() << "var " << tmpvar << " = new TStruct(\"" << name << "\");" << endl
        << indent() << "await oprot.WriteStructBeginAsync(" << tmpvar << ", " << CANCELLATION_TOKEN_NAME << ");" << endl;

    if (fields.size() > 0)
    {
        tmpvar = tmp("tmp");
        out << indent() << "var " << tmpvar << " = new TField();" << endl;
        bool first = true;
        for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
        {
            if (first)
            {
                first = false;
                out << endl << indent() << "if";
            }
            else
            {
                out << indent() << "else if";
            }

            out << "(this.__isset." << get_isset_name(normalize_name((*f_iter)->get_name())) << ")" << endl
                << indent() << "{" << endl;
            indent_up();

            bool null_allowed = type_can_be_null((*f_iter)->get_type());
            if (null_allowed)
            {
                out << indent() << "if (" << prop_name(*f_iter) << " != null)" << endl
                    << indent() << "{" << endl;
                indent_up();
            }

            out << indent() << tmpvar << ".Name = \"" << prop_name(*f_iter) << "\";" << endl
                << indent() << tmpvar << ".Type = " << type_to_enum((*f_iter)->get_type()) << ";" << endl
                << indent() << tmpvar << ".ID = " << (*f_iter)->get_key() << ";" << endl
                << indent() << "await oprot.WriteFieldBeginAsync(" << tmpvar << ", " << CANCELLATION_TOKEN_NAME << ");" << endl;

            generate_serialize_field(out, *f_iter);

            out << indent() << "await oprot.WriteFieldEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;

            if (null_allowed)
            {
                indent_down();
                out << indent() << "}" << endl;
            }

            indent_down();
            out << indent() << "}" << endl;
        }
    }

    out << indent() << "await oprot.WriteFieldStopAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await oprot.WriteStructEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    indent_down();
    out << indent() << "}" << endl
        << indent() << "finally" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "oprot.DecrementRecursionDepth();" << endl;
    indent_down();
    out << indent() << "}" << endl;
    indent_down();
    out << indent() << "}" << endl << endl;
}